

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  ostream *poVar1;
  string local_1f0;
  string local_1d0 [32];
  stringstream out;
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  ::std::__cxx11::string::string((string *)&local_1f0,(string *)&sub->description_);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  if (local_1f0._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)&local_1f0,(string *)&sub->name_);
    ::std::operator<<(local_1a0,(string *)&local_1f0);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_1f0,(string *)&sub->name_);
    poVar1 = ::std::operator<<(local_1a0,(string *)&local_1f0);
    poVar1 = ::std::operator<<(poVar1," -> ");
    ::std::__cxx11::string::string(local_1d0,(string *)&sub->description_);
    ::std::operator<<(poVar1,local_1d0);
    ::std::__cxx11::string::~string(local_1d0);
  }
  ::std::__cxx11::string::~string((string *)&local_1f0);
  make_groups_abi_cxx11_(&local_1f0,this,sub,Sub);
  ::std::operator<<(local_1a0,(string *)&local_1f0);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    if(sub->get_description().empty())
        out << sub->get_name();
    else
        out << sub->get_name() << " -> " << sub->get_description();
    out << make_groups(sub, AppFormatMode::Sub);
    return out.str();
}